

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fTextureUnitTests.cpp
# Opt level: O3

void __thiscall
deqp::gles2::Functional::MultiTexShader::shadeFragments
          (MultiTexShader *this,FragmentPacket *packets,int numPackets,
          FragmentShadingContext *context)

{
  int iVar1;
  pointer pMVar2;
  GenericVec4 *pGVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  float *pfVar10;
  ulong uVar11;
  long lVar12;
  float *pfVar13;
  FragmentPacket *packet;
  int iVar14;
  long lVar15;
  long lVar16;
  long lVar17;
  Vector<float,_3> *res_5;
  float v_3;
  float v;
  float fVar18;
  Vector<float,_3> res_1;
  Vector<float,_3> res;
  Vector<float,_3> res_3;
  Vector<float,_3> res_2;
  Vector<float,_2> vec;
  Vec4 texSamples [4];
  Vec4 outColors [4];
  undefined8 local_1c8;
  undefined4 local_1c0;
  undefined8 local_1b8;
  undefined4 local_1b0;
  float local_1a8 [4];
  rr local_198 [8];
  undefined4 local_190;
  undefined8 local_188;
  undefined4 local_180;
  float local_178 [4];
  Vec3 local_168;
  float afStack_15c [3];
  undefined8 local_150;
  undefined4 local_148;
  float local_144 [3];
  FragmentPacket *local_138;
  ulong local_130;
  ulong local_128;
  ulong local_120;
  float local_118 [4];
  float local_108 [4];
  float local_f8 [2];
  undefined8 uStack_f0;
  float local_e8 [2];
  undefined8 uStack_e0;
  float local_d8 [2];
  undefined8 uStack_d0;
  float local_c8;
  float fStack_c4;
  float fStack_c0;
  float fStack_bc;
  Vec4 local_b8;
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  undefined8 uStack_80;
  float local_78 [2];
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  
  if (0 < numPackets) {
    local_130 = (ulong)(uint)numPackets;
    uVar11 = (ulong)*(uint *)&(this->super_ShaderProgram).field_0x154;
    local_120 = 0;
    local_128 = 0;
    local_138 = packets;
    do {
      local_48 = 0;
      uStack_40 = 0;
      local_58 = 0;
      uStack_50 = 0;
      local_68 = 0;
      uStack_60 = 0;
      local_78[0] = 0.0;
      local_78[1] = 0.0;
      uStack_70 = 0;
      if (0 < (int)uVar11) {
        packet = local_138 + local_128;
        local_c8 = 1.0 / (float)(int)uVar11;
        lVar17 = 0;
        lVar16 = 0;
        fStack_c4 = local_c8;
        fStack_c0 = local_c8;
        fStack_bc = local_c8;
        do {
          local_88 = 0;
          uStack_80 = 0;
          local_98 = 0;
          uStack_90 = 0;
          local_a8 = 0;
          uStack_a0 = 0;
          local_b8.m_data[0] = 0.0;
          local_b8.m_data[1] = 0.0;
          local_b8.m_data[2] = 0.0;
          local_b8.m_data[3] = 0.0;
          rr::readTriangleVarying<float>((rr *)&local_168,packet,context,0,0);
          local_f8[0] = local_168.m_data[0];
          local_f8[1] = local_168.m_data[1];
          uStack_f0 = 0;
          rr::readTriangleVarying<float>((rr *)&local_1b8,packet,context,0,1);
          local_e8[0] = (float)local_1b8;
          local_e8[1] = local_1b8._4_4_;
          uStack_e0 = 0;
          rr::readTriangleVarying<float>(local_198,packet,context,0,2);
          local_d8 = (float  [2])local_198;
          uStack_d0 = 0;
          rr::readTriangleVarying<float>((rr *)&local_1c8,packet,context,0,3);
          uVar8 = local_1c8;
          if ((this->m_unitTypes).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
              _M_impl.super__Vector_impl_data._M_start[lVar16] == 0xde1) {
            pMVar2 = (this->m_transformations).
                     super__Vector_base<tcu::Matrix<float,_3,_3>,_std::allocator<tcu::Matrix<float,_3,_3>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            local_198 = (rr  [8])local_f8;
            local_190 = 0x3f800000;
            local_1b8._0_4_ = 0.0;
            local_1b8._4_4_ = 0.0;
            local_1b0 = 0;
            pfVar10 = (float *)((long)(pMVar2->m_data).m_data[0].m_data + lVar17);
            lVar12 = 0;
            do {
              fVar18 = 0.0;
              lVar15 = 0;
              pfVar13 = pfVar10;
              do {
                fVar18 = fVar18 + *pfVar13 * *(float *)(local_198 + lVar15 * 4);
                lVar15 = lVar15 + 1;
                pfVar13 = pfVar13 + 3;
              } while (lVar15 != 3);
              *(float *)((long)&local_1b8 + lVar12 * 4) = fVar18;
              lVar12 = lVar12 + 1;
              pfVar10 = pfVar10 + 1;
            } while (lVar12 != 3);
            local_168.m_data[0] = (float)local_1b8;
            local_168.m_data[1] = local_1b8._4_4_;
            local_1a8[0] = local_e8[0];
            local_1a8[1] = local_e8[1];
            local_1a8[2] = 1.0;
            local_1c8._0_4_ = 0.0;
            local_1c8._4_4_ = 0.0;
            local_1c0 = 0;
            pfVar10 = (float *)((long)(pMVar2->m_data).m_data[0].m_data + lVar17);
            lVar12 = 0;
            do {
              fVar18 = 0.0;
              lVar15 = 0;
              pfVar13 = pfVar10;
              do {
                fVar18 = fVar18 + *pfVar13 * local_1a8[lVar15];
                lVar15 = lVar15 + 1;
                pfVar13 = pfVar13 + 3;
              } while (lVar15 != 3);
              *(float *)((long)&local_1c8 + lVar12 * 4) = fVar18;
              uVar9 = local_1c8;
              lVar12 = lVar12 + 1;
              pfVar10 = pfVar10 + 1;
            } while (lVar12 != 3);
            local_168.m_data[2] = (float)local_1c8;
            afStack_15c[0] = SUB84(local_1c8,4);
            local_108[0] = local_d8[0];
            local_108[1] = local_d8[1];
            local_108[2] = 1.0;
            local_178[0] = 0.0;
            local_178[1] = 0.0;
            local_178[2] = 0.0;
            pfVar10 = (float *)((long)(pMVar2->m_data).m_data[0].m_data + lVar17);
            lVar12 = 0;
            do {
              fVar18 = 0.0;
              lVar15 = 0;
              pfVar13 = pfVar10;
              do {
                fVar18 = fVar18 + *pfVar13 * local_108[lVar15];
                lVar15 = lVar15 + 1;
                pfVar13 = pfVar13 + 3;
              } while (lVar15 != 3);
              local_178[lVar12] = fVar18;
              lVar12 = lVar12 + 1;
              pfVar10 = pfVar10 + 1;
            } while (lVar12 != 3);
            afStack_15c[1] = (float)local_178._0_8_;
            afStack_15c[2] = SUB84(local_178._0_8_,4);
            local_1c8._0_4_ = (float)uVar8;
            local_1c8._4_4_ = SUB84(uVar8,4);
            local_118[0] = (float)local_1c8;
            local_118[1] = local_1c8._4_4_;
            local_118[2] = 1.0;
            local_188 = 0;
            local_180 = 0;
            pfVar10 = (float *)((long)(pMVar2->m_data).m_data[0].m_data + lVar17);
            lVar12 = 0;
            do {
              fVar18 = 0.0;
              lVar15 = 0;
              pfVar13 = pfVar10;
              do {
                fVar18 = fVar18 + *pfVar13 * local_118[lVar15];
                lVar15 = lVar15 + 1;
                pfVar13 = pfVar13 + 3;
              } while (lVar15 != 3);
              *(float *)((long)&local_188 + lVar12 * 4) = fVar18;
              lVar12 = lVar12 + 1;
              pfVar10 = pfVar10 + 1;
            } while (lVar12 != 3);
            local_150 = local_188;
            local_1c8 = uVar9;
            sglr::rc::Texture2D::sample4
                      ((this->super_ShaderProgram).m_uniforms.
                       super__Vector_base<sglr::UniformSlot,_std::allocator<sglr::UniformSlot>_>.
                       _M_impl.super__Vector_impl_data._M_start[(int)lVar16 * 2].sampler.tex2D,
                       &local_b8,(Vec2 *)&local_168,0.0);
          }
          else {
            pMVar2 = (this->m_transformations).
                     super__Vector_base<tcu::Matrix<float,_3,_3>,_std::allocator<tcu::Matrix<float,_3,_3>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            local_1b8._0_4_ = local_f8[0];
            local_1b8._4_4_ = local_f8[1];
            local_1b0 = 0x3f800000;
            local_168.m_data[0] = 0.0;
            local_168.m_data[1] = 0.0;
            local_168.m_data[2] = 0.0;
            pfVar10 = (float *)((long)(pMVar2->m_data).m_data[0].m_data + lVar17);
            lVar12 = 0;
            do {
              fVar18 = 0.0;
              lVar15 = 0;
              pfVar13 = pfVar10;
              do {
                fVar18 = fVar18 + *pfVar13 * *(float *)((long)&local_1b8 + lVar15 * 4);
                lVar15 = lVar15 + 1;
                pfVar13 = pfVar13 + 3;
              } while (lVar15 != 3);
              local_168.m_data[lVar12] = fVar18;
              lVar12 = lVar12 + 1;
              pfVar10 = pfVar10 + 1;
            } while (lVar12 != 3);
            local_198 = (rr  [8])local_e8;
            local_190 = 0x3f800000;
            afStack_15c[2] = 0.0;
            afStack_15c[0] = 0.0;
            afStack_15c[1] = 0.0;
            pfVar10 = (float *)((long)(pMVar2->m_data).m_data[0].m_data + lVar17);
            lVar12 = 0;
            do {
              fVar18 = 0.0;
              lVar15 = 0;
              pfVar13 = pfVar10;
              do {
                fVar18 = fVar18 + *pfVar13 * *(float *)(local_198 + lVar15 * 4);
                lVar15 = lVar15 + 1;
                pfVar13 = pfVar13 + 3;
              } while (lVar15 != 3);
              afStack_15c[lVar12] = fVar18;
              lVar12 = lVar12 + 1;
              pfVar10 = pfVar10 + 1;
            } while (lVar12 != 3);
            local_1c8._0_4_ = local_d8[0];
            local_1c8._4_4_ = local_d8[1];
            uVar9 = local_1c8;
            local_1c0 = 0x3f800000;
            local_148 = 0;
            local_150 = 0;
            pfVar10 = (float *)((long)(pMVar2->m_data).m_data[0].m_data + lVar17);
            lVar12 = 0;
            do {
              fVar18 = 0.0;
              lVar15 = 0;
              pfVar13 = pfVar10;
              do {
                fVar18 = fVar18 + *pfVar13 * *(float *)((long)&local_1c8 + lVar15 * 4);
                lVar15 = lVar15 + 1;
                pfVar13 = pfVar13 + 3;
              } while (lVar15 != 3);
              *(float *)((long)&local_150 + lVar12 * 4) = fVar18;
              lVar12 = lVar12 + 1;
              pfVar10 = pfVar10 + 1;
            } while (lVar12 != 3);
            local_1c8._0_4_ = (float)uVar8;
            local_1c8._4_4_ = SUB84(uVar8,4);
            local_1a8[0] = (float)local_1c8;
            local_1a8[1] = local_1c8._4_4_;
            local_1a8[2] = 1.0;
            local_144[2] = 0.0;
            local_144[0] = 0.0;
            local_144[1] = 0.0;
            pfVar10 = (float *)((long)(pMVar2->m_data).m_data[0].m_data + lVar17);
            lVar12 = 0;
            do {
              fVar18 = 0.0;
              lVar15 = 0;
              pfVar13 = pfVar10;
              do {
                fVar18 = fVar18 + *pfVar13 * local_1a8[lVar15];
                lVar15 = lVar15 + 1;
                pfVar13 = pfVar13 + 3;
              } while (lVar15 != 3);
              local_144[lVar12] = fVar18;
              lVar12 = lVar12 + 1;
              pfVar10 = pfVar10 + 1;
            } while (lVar12 != 3);
            local_1c8 = uVar9;
            sglr::rc::TextureCube::sample4
                      ((this->super_ShaderProgram).m_uniforms.
                       super__Vector_base<sglr::UniformSlot,_std::allocator<sglr::UniformSlot>_>.
                       _M_impl.super__Vector_impl_data._M_start[(int)lVar16 * 2].sampler.texCube,
                       &local_b8,&local_168,0.0);
          }
          lVar12 = 0;
          do {
            fVar18 = *(float *)((long)local_b8.m_data + lVar12 + 4);
            fVar4 = *(float *)((long)local_b8.m_data + lVar12 + 8);
            fVar5 = *(float *)((long)local_b8.m_data + lVar12 + 0xc);
            fVar6 = *(float *)((long)&uStack_70 + lVar12);
            fVar7 = *(float *)((long)&uStack_70 + lVar12 + 4);
            *(float *)((long)local_78 + lVar12) =
                 *(float *)((long)local_b8.m_data + lVar12) * local_c8 +
                 *(float *)((long)local_78 + lVar12);
            *(float *)((long)local_78 + lVar12 + 4) =
                 fVar18 * fStack_c4 + *(float *)((long)local_78 + lVar12 + 4);
            *(float *)((long)&uStack_70 + lVar12) = fVar4 * fStack_c0 + fVar6;
            *(float *)((long)&uStack_70 + lVar12 + 4) = fVar5 * fStack_bc + fVar7;
            lVar12 = lVar12 + 0x10;
          } while (lVar12 != 0x40);
          lVar16 = lVar16 + 1;
          uVar11 = (ulong)*(int *)&(this->super_ShaderProgram).field_0x154;
          lVar17 = lVar17 + 0x24;
        } while (lVar16 < (long)uVar11);
      }
      pGVar3 = context->outputArray;
      iVar1 = context->numFragmentOutputs;
      iVar14 = iVar1 * (int)local_120;
      lVar16 = 0;
      do {
        uVar8 = *(undefined8 *)((long)&uStack_70 + lVar16);
        *(undefined8 *)&pGVar3[iVar14].v = *(undefined8 *)((long)local_78 + lVar16);
        *(undefined8 *)((long)&pGVar3[iVar14].v + 8) = uVar8;
        lVar16 = lVar16 + 0x10;
        iVar14 = iVar14 + iVar1;
      } while (lVar16 != 0x40);
      local_128 = local_128 + 1;
      local_120 = (ulong)((int)local_120 + 4);
    } while (local_128 != local_130);
  }
  return;
}

Assistant:

void MultiTexShader::shadeFragments	(rr::FragmentPacket* packets, const int numPackets, const rr::FragmentShadingContext& context) const
{
	DE_ASSERT((int)m_unitTypes.size() == m_numUnits);
	DE_ASSERT((int)m_transformations.size() == m_numUnits);
	DE_ASSERT((int)m_lodDerivateParts.size() == m_numUnits);

	for (int packetNdx = 0; packetNdx < numPackets; ++packetNdx)
	{
		rr::FragmentPacket& packet				= packets[packetNdx];
		const float			colorMultiplier		= 1.0f / (float)m_numUnits;
		Vec4				outColors[4]		= { Vec4(0.0f), Vec4(0.0f), Vec4(0.0f), Vec4(0.0f) };

		for (int unitNdx = 0; unitNdx < m_numUnits; unitNdx++)
		{
			tcu::Vec4 texSamples[4];

			// Read tex coords
			const tcu::Vec2 texCoords[4] =
			{
				rr::readTriangleVarying<float>(packet, context, 0, 0).xy(),
				rr::readTriangleVarying<float>(packet, context, 0, 1).xy(),
				rr::readTriangleVarying<float>(packet, context, 0, 2).xy(),
				rr::readTriangleVarying<float>(packet, context, 0, 3).xy(),
			};

			if (m_unitTypes[unitNdx] == GL_TEXTURE_2D)
			{
				// Transform
				const tcu::Vec2 transformedTexCoords[4] =
				{
					(m_transformations[unitNdx] * Vec3(texCoords[0].x(), texCoords[0].y(), 1.0f)).xy(),
					(m_transformations[unitNdx] * Vec3(texCoords[1].x(), texCoords[1].y(), 1.0f)).xy(),
					(m_transformations[unitNdx] * Vec3(texCoords[2].x(), texCoords[2].y(), 1.0f)).xy(),
					(m_transformations[unitNdx] * Vec3(texCoords[3].x(), texCoords[3].y(), 1.0f)).xy(),
				};

				// Sample
				m_uniforms[2*unitNdx].sampler.tex2D->sample4(texSamples, transformedTexCoords);
			}
			else
			{
				DE_ASSERT(m_unitTypes[unitNdx] == GL_TEXTURE_CUBE_MAP);

				// Transform
				const tcu::Vec3 transformedTexCoords[4] =
				{
					m_transformations[unitNdx] * Vec3(texCoords[0].x(), texCoords[0].y(), 1.0f),
					m_transformations[unitNdx] * Vec3(texCoords[1].x(), texCoords[1].y(), 1.0f),
					m_transformations[unitNdx] * Vec3(texCoords[2].x(), texCoords[2].y(), 1.0f),
					m_transformations[unitNdx] * Vec3(texCoords[3].x(), texCoords[3].y(), 1.0f),
				};

				// Sample
				m_uniforms[2*unitNdx].sampler.texCube->sample4(texSamples, transformedTexCoords);
			}

			// Add to sum
			for (int fragNdx = 0; fragNdx < 4; ++fragNdx)
				outColors[fragNdx] += colorMultiplier * texSamples[fragNdx];
		}

		// output
		for (int fragNdx = 0; fragNdx < 4; ++fragNdx)
			rr::writeFragmentOutput(context, packetNdx, fragNdx, 0, outColors[fragNdx]);
	}
}